

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void crec_copy(jit_State *J,TRef trdst,TRef trsrc,TRef trlen,CType *ct)

{
  ulong uVar1;
  CTypeID1 CVar2;
  CTSize CVar3;
  CType *pCVar4;
  IRType IVar5;
  IRType IVar6;
  TRef TVar7;
  TRef TVar8;
  uint uVar9;
  cTValue *tv;
  ulong uVar10;
  IRType IVar11;
  IRType *pIVar12;
  CTState *cts;
  ulong uVar13;
  long lVar14;
  CTypeID1 CVar15;
  IRType IVar16;
  uint uVar17;
  CType *ct_00;
  TRef *pTVar18;
  uint uVar19;
  bool bVar20;
  CRecMemList ml [16];
  CTSize local_138;
  IRType local_134;
  TRef local_130 [64];
  
  if (-1 < (short)trlen) {
    IVar6 = (J->cur).ir[trlen & 0x7fff].field_1.op12;
    if (IVar6 == IRT_NIL) {
      return;
    }
    if (IVar6 < (IRT_GUARD|IRT_FALSE)) {
      IVar16 = IRT_U64;
      uVar19 = 8;
      IVar11 = IRT_NIL;
      if (ct == (CType *)0x0) {
LAB_00136940:
        bVar20 = false;
LAB_00136967:
        uVar13 = 0;
        do {
          if (uVar19 + IVar11 <= IVar6) {
            uVar10 = uVar13;
            if ((uint)uVar13 < 0x11) {
              uVar10 = 0x10;
            }
            pIVar12 = &local_134 + uVar13 * 4;
            lVar14 = 0;
            do {
              if (uVar13 - uVar10 == lVar14) goto LAB_00136776;
              pIVar12[-1] = IVar11;
              *pIVar12 = IVar16;
              lVar14 = lVar14 + -1;
              pIVar12 = pIVar12 + 4;
              IVar11 = IVar11 + uVar19;
            } while (uVar19 + IVar11 <= IVar6);
            uVar13 = (ulong)((uint)uVar13 - (int)lVar14);
          }
          uVar19 = uVar19 >> 1;
          IVar16 = IVar16 - IRT_TRUE;
        } while (IVar11 < IVar6);
      }
      else {
        cts = (CTState *)(ulong)J[-1].bpropcache[9].mode;
        uVar9 = ct->info;
        if ((uVar9 & 0xf0000000) == 0x30000000) {
          IVar5 = crec_ct2irt(cts,(CType *)((long)&cts->tab->info + (ulong)((uVar9 & 0xffff) << 4)))
          ;
          bVar20 = IVar5 != IRT_CDATA;
          if (bVar20) {
            uVar19 = (uint)"\x04\x04\x04\b\x04\x04\x04\x04\x04\b\x04\x04\x04\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                           [IVar5];
            IVar16 = IVar5;
          }
          goto LAB_00136967;
        }
        if ((uVar9 >> 0x17 & 1) != 0) goto LAB_00136940;
        if (ct->sib == 0) goto LAB_00136776;
        pCVar4 = cts->tab;
        uVar13 = 0;
        CVar15 = ct->sib;
        do {
          CVar2 = pCVar4[CVar15].sib;
          uVar19 = pCVar4[CVar15].info >> 0x1c;
          if (uVar19 != 0xb) {
            if (uVar19 != 9) goto LAB_00136776;
            if (pCVar4[CVar15].name.gcptr32 != 0) {
              uVar10 = (ulong)((pCVar4[CVar15].info & 0xffff) << 4);
              uVar19 = *(uint *)((long)&pCVar4->info + uVar10);
              ct_00 = (CType *)((long)&pCVar4->info + uVar10);
              IVar6 = crec_ct2irt(cts,ct_00);
              if ((IVar6 == IRT_CDATA) || (uVar9 = (uint)uVar13, 0xf < uVar9)) goto LAB_00136776;
              CVar3 = pCVar4[CVar15].size;
              (&local_138)[uVar13 * 4] = CVar3;
              (&local_134)[uVar13 * 4] = IVar6;
              uVar17 = uVar9 + 1;
              if ((uVar19 & 0xf4000000) == 0x34000000) {
                if (uVar9 == 0xf) goto LAB_00136776;
                (&local_138)[(ulong)uVar17 * 4] = (ct_00->size >> 1) + CVar3;
                (&local_134)[(ulong)uVar17 * 4] = IVar6;
                uVar13 = (ulong)(uVar9 + 2);
              }
              else {
                uVar13 = (ulong)uVar17;
              }
            }
          }
          CVar15 = CVar2;
        } while (CVar2 != 0);
        bVar20 = true;
      }
      if ((int)uVar13 != 0) {
        uVar17 = 1;
        uVar19 = 0;
        uVar9 = 0;
        uVar10 = 0;
        do {
          tv = lj_ir_k64_find(J,(ulong)(&local_138)[uVar10 * 4]);
          TVar7 = lj_ir_k64(J,IR_KINT64,tv);
          (J->fold).ins.field_0.ot = 0x2809;
          (J->fold).ins.field_0.op1 = (IRRef1)trsrc;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
          TVar8 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)(&local_134)[uVar10 * 4] | 0x4400;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = 0;
          TVar8 = lj_opt_fold(J);
          local_130[uVar10 * 4 + 1] = TVar8;
          local_130[uVar10 * 4] = TVar7;
          uVar1 = uVar10 + 1;
          uVar9 = uVar9 + 1;
          if ((3 < uVar9) || (uVar13 <= uVar1)) {
            uVar9 = 0;
            if (uVar19 <= uVar10) {
              pTVar18 = local_130 + (ulong)uVar19 * 4 + 1;
              do {
                TVar7 = pTVar18[0xffffffffffffffff];
                (J->fold).ins.field_0.ot = 0x2809;
                (J->fold).ins.field_0.op1 = (IRRef1)trdst;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar8 = lj_opt_fold(J);
                TVar7 = *pTVar18;
                (J->fold).ins.field_0.ot = (ushort)pTVar18[0xfffffffffffffffe] | 0x4b00;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                lj_opt_fold(J);
                uVar19 = uVar19 + 1;
                pTVar18 = pTVar18 + 4;
              } while (uVar17 != uVar19);
              uVar9 = 0;
              uVar19 = uVar17;
            }
          }
          uVar17 = uVar17 + 1;
          uVar10 = uVar1;
        } while (uVar1 != uVar13);
        if (bVar20) {
          return;
        }
        goto LAB_0013678b;
      }
    }
  }
LAB_00136776:
  lj_ir_call(J,IRCALL_memcpy,(ulong)trdst,(ulong)trsrc,(ulong)trlen);
LAB_0013678b:
  (J->fold).ins.field_0.ot = 0x5400;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_copy(jit_State *J, TRef trdst, TRef trsrc, TRef trlen,
		      CType *ct)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_COPY_MAXUNROLL];
    MSize mlp = 0;
    CTSize step = 1, len = (CTSize)IR(tref_ref(trlen))->i;
    IRType tp = IRT_CDATA;
    int needxbar = 0;
    if (len == 0) return;  /* Shortcut. */
    if (len > CREC_COPY_MAXLEN) goto fallback;
    if (ct) {
      CTState *cts = ctype_ctsG(J2G(J));
      lua_assert(ctype_isarray(ct->info) || ctype_isstruct(ct->info));
      if (ctype_isarray(ct->info)) {
	CType *cct = ctype_rawchild(cts, ct);
	tp = crec_ct2irt(cts, cct);
	if (tp == IRT_CDATA) goto rawcopy;
	step = lj_ir_type_size[tp];
	lua_assert((len & (step-1)) == 0);
      } else if ((ct->info & CTF_UNION)) {
	step = (1u << ctype_align(ct->info));
	goto rawcopy;
      } else {
	mlp = crec_copy_struct(ml, cts, ct);
	goto emitcopy;
      }
    } else {
    rawcopy:
      needxbar = 1;
      if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
	step = CTSIZE_PTR;
    }
    mlp = crec_copy_unroll(ml, len, step, tp);
  emitcopy:
    if (mlp) {
      crec_copy_emit(J, ml, mlp, trdst, trsrc);
      if (needxbar)
	emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
      return;
    }
  }
fallback:
  /* Call memcpy. Always needs a barrier to disable alias analysis. */
  lj_ir_call(J, IRCALL_memcpy, trdst, trsrc, trlen);
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}